

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall resetOnEndTimeFixture::createSession(resetOnEndTimeFixture *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  sessionFixture *psVar4;
  sessionFixture *psVar5;
  
  FIX::UtcTimeStamp::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now);
  psVar4 = &(this->super_acceptorFixture).super_sessionFixture;
  uVar1 = *(undefined4 *)&(psVar4->super_TestCallback).now.super_DateTime.field_0xc;
  iVar3 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
          m_time;
  psVar5 = &(this->super_acceptorFixture).super_sessionFixture;
  (psVar5->super_TestCallback).startTimeStamp.super_DateTime.m_date =
       (psVar4->super_TestCallback).now.super_DateTime.m_date;
  *(undefined4 *)&(psVar5->super_TestCallback).startTimeStamp.super_DateTime.field_0xc = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = iVar3;
  FIX::DateTime::setMillisecond
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
              super_DateTime,0);
  psVar4 = &(this->super_acceptorFixture).super_sessionFixture;
  uVar1 = *(undefined4 *)&(psVar4->super_TestCallback).startTimeStamp.super_DateTime.field_0xc;
  iVar3 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
          super_DateTime.m_time;
  psVar5 = &(this->super_acceptorFixture).super_sessionFixture;
  (psVar5->super_TestCallback).endTimeStamp.super_DateTime.m_date =
       (psVar4->super_TestCallback).startTimeStamp.super_DateTime.m_date;
  *(undefined4 *)&(psVar5->super_TestCallback).endTimeStamp.super_DateTime.field_0xc = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime.
  m_time = iVar3;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  uVar2 = *(undefined8 *)
           &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
            super_DateTime.field_0xc;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = uVar2;
  uVar1 = *(undefined4 *)
           ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.
                   startTimeStamp.super_DateTime.m_time + 4);
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = uVar2;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) = uVar1;
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
              super_DateTime,2);
  anon_unknown.dwarf_334836::sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }